

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::LayerNormalizationLayerParams::MergePartialFromCodedStream
          (LayerNormalizationLayerParams *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  RepeatedField<long> *pRVar5;
  WeightParams *pWVar6;
  bool local_89;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  LayerNormalizationLayerParams *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    kMax1ByteVarint = 0x7f;
    tag_2 = 0;
    _first_byte_or_zero = input;
    if ((input->buffer_ < input->buffer_end_) &&
       (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
      local_24 = 0x7f;
      kMax2ByteVarint = (uint32)*input->buffer_;
      google::protobuf::io::CodedInputStream::Advance(input,1);
      local_89 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
      tag_3._3_1_ = local_89;
      pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    else {
      local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
      local_3d = local_3c[0] - 1 < kMax1ByteVarint;
      pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
      local_10 = pVar4.first;
      uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
    }
    tag_00 = local_10;
    if ((uStack_c & 1) == 0) {
switchD_002ef8b2_default:
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
    }
    else {
      iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10);
      switch(iVar2) {
      case 1:
        if ((tag_00 & 0xff) == 10) {
          pRVar5 = mutable_normalizedshape(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadPackedPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (input,pRVar5);
        }
        else {
          if ((tag_00 & 0xff) != 8) goto switchD_002ef8b2_default;
          pRVar5 = mutable_normalizedshape(this);
          bVar1 = google::protobuf::internal::WireFormatLite::
                  ReadRepeatedPrimitiveNoInline<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                            (1,10,input,pRVar5);
        }
        break;
      case 2:
        if ((tag_00 & 0xff) != 0x15) goto switchD_002ef8b2_default;
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          (input,&this->eps_);
        break;
      case 3:
        if ((tag_00 & 0xff) != 0x1a) goto switchD_002ef8b2_default;
        pWVar6 = mutable_gamma(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::WeightParams>(input,pWVar6);
        break;
      case 4:
        if ((tag_00 & 0xff) != 0x22) goto switchD_002ef8b2_default;
        pWVar6 = mutable_beta(this);
        bVar1 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::WeightParams>(input,pWVar6);
        break;
      default:
        goto switchD_002ef8b2_default;
      }
    }
    if (!bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

bool LayerNormalizationLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.LayerNormalizationLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated int64 normalizedShape = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, this->mutable_normalizedshape())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(8u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 1, 10u, input, this->mutable_normalizedshape())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float eps = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &eps_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams gamma = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_gamma()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.WeightParams beta = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_beta()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.LayerNormalizationLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.LayerNormalizationLayerParams)
  return false;
#undef DO_
}